

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Boolean UA_Node_hasSubTypeOrInstances(UA_Node *node)

{
  UA_Boolean UVar1;
  ulong local_50;
  size_t i;
  UA_NodeId hasTypeDefinition;
  UA_NodeId hasSubType;
  UA_Node *node_local;
  
  UA_NODEID_NUMERIC((UA_NodeId *)((long)&hasTypeDefinition.identifier + 8),0,0x2d);
  UA_NODEID_NUMERIC((UA_NodeId *)&i,0,0x28);
  local_50 = 0;
  while( true ) {
    if (node->referencesSize <= local_50) {
      return false;
    }
    if (((node->references[local_50].isInverse & 1U) == 0) &&
       (UVar1 = UA_NodeId_equal(&node->references[local_50].referenceTypeId,
                                (UA_NodeId *)((long)&hasTypeDefinition.identifier + 8)), UVar1))
    break;
    if (((node->references[local_50].isInverse & 1U) == 1) &&
       (UVar1 = UA_NodeId_equal(&node->references[local_50].referenceTypeId,(UA_NodeId *)&i), UVar1)
       ) {
      return true;
    }
    local_50 = local_50 + 1;
  }
  return true;
}

Assistant:

UA_Boolean
UA_Node_hasSubTypeOrInstances(const UA_Node *node) {
    const UA_NodeId hasSubType = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    const UA_NodeId hasTypeDefinition = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == false &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasSubType))
            return true;
        if(node->references[i].isInverse == true &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasTypeDefinition))
            return true;
    }
    return false;
}